

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void __thiscall
glu::sl::ShaderParser::parseImport
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Archive *archive;
  pointer pcVar4;
  ShaderParser *this_00;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> importedCases;
  string importFileName;
  ShaderParser subParser;
  allocator<char> local_199;
  string local_198;
  undefined1 *local_178;
  long local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  FilePath local_158;
  FilePath local_138;
  string local_118;
  FilePath local_f8;
  FilePath local_d8;
  undefined1 local_b8 [136];
  
  local_178 = &local_168;
  local_170 = 0;
  local_168 = 0;
  assumeToken(this,TOKEN_IMPORT);
  advanceToken(this);
  this_00 = (ShaderParser *)0x2;
  assumeToken(this,TOKEN_STRING);
  parseStringLiteral_abi_cxx11_((string *)local_b8,this_00,(this->m_curTokenStr)._M_dataplus._M_p);
  std::__cxx11::string::operator=((string *)&local_178,(string *)local_b8);
  if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  assumeToken(this,TOKEN_STRING);
  advanceToken(this);
  archive = this->m_archive;
  paVar2 = &local_138.m_path.field_2;
  pcVar4 = (this->m_filename)._M_dataplus._M_p;
  local_138.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar4,pcVar4 + (this->m_filename)._M_string_length);
  de::FilePath::getDirName_abi_cxx11_(&local_118,&local_138);
  paVar3 = &local_f8.m_path.field_2;
  local_f8.m_path._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  paVar1 = &local_158.m_path.field_2;
  local_158.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_178,local_178 + local_170);
  de::FilePath::join(&local_d8,&local_f8,&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,local_d8.m_path._M_dataplus._M_p,&local_199);
  ShaderParser((ShaderParser *)local_b8,archive,&local_198,this->m_caseFactory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_path._M_dataplus._M_p != &local_d8.m_path.field_2) {
    operator_delete(local_d8.m_path._M_dataplus._M_p,
                    local_d8.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_158.m_path._M_dataplus._M_p,
                    local_158.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.m_path._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8.m_path._M_dataplus._M_p,
                    local_f8.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_138.m_path._M_dataplus._M_p,
                    local_138.m_path.field_2._M_allocated_capacity + 1);
  }
  parse((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_198,
        (ShaderParser *)local_b8);
  std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<tcu::TestNode*const*,std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>>>
            ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList,
             (shaderNodeList->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)
             ._M_impl.super__Vector_impl_data._M_finish,local_198._M_dataplus._M_p,
             local_198._M_string_length);
  if (local_198._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_198._M_dataplus._M_p,
                    local_198.field_2._M_allocated_capacity - (long)local_198._M_dataplus._M_p);
  }
  ~ShaderParser((ShaderParser *)local_b8);
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  return;
}

Assistant:

void ShaderParser::parseImport (vector<tcu::TestNode*>& shaderNodeList)
{
	std::string	importFileName;

	advanceToken(TOKEN_IMPORT);

	assumeToken(TOKEN_STRING);
	importFileName = parseStringLiteral(m_curTokenStr.c_str());
	advanceToken(TOKEN_STRING);

	{
		ShaderParser					subParser		(m_archive, de::FilePath::join(de::FilePath(m_filename).getDirName(), importFileName).getPath(), m_caseFactory);
		const vector<tcu::TestNode*>	importedCases = subParser.parse();

		// \todo [2015-08-03 pyry] Not exception safe
		shaderNodeList.insert(shaderNodeList.end(), importedCases.begin(), importedCases.end());
	}
}